

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::detail::
db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::operator()(db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             *this,olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                   *inode_ptr)

{
  olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *pointer;
  qsbr_per_thread *this_00;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_01;
  debug_callback local_38;
  olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_18;
  olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode_ptr_local;
  db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  local_18 = inode_ptr;
  inode_ptr_local =
       (olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)this;
  this_00 = this_thread();
  pointer = local_18;
  std::function<void(void_const*)>::function<void(&)(void_const*)noexcept,void>
            ((function<void(void_const*)> *)&local_38,olc_node_header::check_on_dealloc);
  qsbr_per_thread::on_next_epoch_deallocate(this_00,pointer,0x2c0,&local_38);
  std::function<void_(const_void_*)>::~function(&local_38);
  this_01 = basic_db_inode_deleter<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
            ::get_db(&this->
                      super_db_inode_qsbr_deleter_parent<unsigned_long,_std::span<const_std::byte>,_unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte>_>_>
                    );
  olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
  decrement_inode_count<unodb::detail::olc_inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            ((olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)this_01);
  return;
}

Assistant:

void operator()(INode* inode_ptr) {
    static_assert(std::is_trivially_destructible_v<INode>);

    this_thread().on_next_epoch_deallocate(inode_ptr
#ifdef UNODB_DETAIL_WITH_STATS
                                           ,
                                           sizeof(INode)
#endif
#ifndef NDEBUG
                                               ,
                                           olc_node_header::check_on_dealloc
#endif
    );

#ifdef UNODB_DETAIL_WITH_STATS
    this->get_db().template decrement_inode_count<INode>();
#endif  // UNODB_DETAIL_WITH_STATS
  }